

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O3

void __thiscall rw::Frame::destroyHierarchy(Frame *this)

{
  Frame *pFVar1;
  LLLink *pLVar2;
  LLLink *pLVar3;
  Frame *this_00;
  
  this_00 = this->child;
  while (this_00 != (Frame *)0x0) {
    pFVar1 = this_00->next;
    destroyHierarchy(this_00);
    this_00 = pFVar1;
  }
  PluginList::destruct((PluginList *)&s_plglist,this);
  if (((this->object).privateFlags & 3) != 0) {
    pLVar2 = (this->inDirtyList).next;
    pLVar3 = (this->inDirtyList).prev;
    pLVar3->next = pLVar2;
    pLVar2->prev = pLVar3;
  }
  (*DAT_00149de0)(this);
  return;
}

Assistant:

void
Frame::destroyHierarchy(void)
{
	Frame *next;
	for(Frame *child = this->child; child; child = next){
		next = child->next;
		child->destroyHierarchy();
	}
	assert(this->objectList.isEmpty());
	s_plglist.destruct(this);
	if(this->object.privateFlags & Frame::HIERARCHYSYNC)
		this->inDirtyList.remove();
	rwFree(this);
}